

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gchtfind.c
# Opt level: O3

LispPTR rec_htfind(LispPTR ptr,int casep)

{
  uint *puVar1;
  uint uVar2;
  LispPTR LVar3;
  ulong uVar4;
  LispPTR *pLVar5;
  uint *puVar6;
  uint *puVar7;
  uint uVar8;
  
  uVar2 = ptr >> 0xf & 0x1ffe;
  puVar1 = (uint *)((long)HTmain + (ulong)(ptr & 0xfffe) * 2);
  uVar8 = *puVar1;
  if (uVar8 == 0) {
    if (casep == 2) {
      uVar2 = uVar2 | 0x30000;
    }
    else {
      if (casep == 1) {
        *puVar1 = uVar2;
        return ptr;
      }
      if (casep != 0) {
LAB_00124355:
        error("GC error: new entry when turning off stack bit");
        return 0;
      }
      uVar2 = uVar2 | 0x40000;
    }
    *puVar1 = uVar2;
  }
  else {
    if ((uVar8 & 1) == 0) {
      if (uVar2 != (uVar8 & 0x1ffe)) {
        uVar4 = (ulong)*HTcoll;
        if (uVar4 == 0) {
          uVar4 = (ulong)HTcoll[1];
          if (0x7ffef < uVar4) goto LAB_001242b2;
          HTcoll[1] = HTcoll[1] + 2;
        }
        else {
          *HTcoll = HTcoll[uVar4 + 1];
        }
        pLVar5 = HTcoll + uVar4;
        uVar4 = (ulong)*HTcoll;
        if (uVar4 == 0) {
          uVar4 = (ulong)HTcoll[1];
          if (0x7ffef < uVar4) {
LAB_001242b2:
            disablegc1(0);
            return 0;
          }
          HTcoll[1] = HTcoll[1] + 2;
        }
        else {
          *HTcoll = HTcoll[uVar4 + 1];
        }
        puVar7 = HTcoll + uVar4;
        puVar7[1] = 0;
        *puVar7 = uVar8;
        pLVar5[1] = (LispPTR)((ulong)((long)puVar7 - (long)HTcoll) >> 2);
        *puVar1 = (int)((ulong)((long)pLVar5 - (long)HTcoll) >> 2) + 1;
LAB_00124340:
        if (casep == 2) {
          LVar3 = uVar2 | 0x30000;
        }
        else {
          if (casep == 1) {
            *pLVar5 = uVar2;
            return ptr;
          }
          if (casep != 0) goto LAB_00124355;
          LVar3 = uVar2 | 0x40000;
        }
        *pLVar5 = LVar3;
        return 0;
      }
      puVar7 = puVar1;
      if (uVar8 < 0xfffe0000) {
        if (casep == 2) {
          uVar2 = uVar8 | 0x10000;
        }
        else {
          if (casep == 1) {
            if (uVar8 < 0x20000) {
              error("attempt to decrement 0 reference count");
            }
            uVar2 = uVar8 - 0x20000;
          }
          else {
            uVar2 = uVar8;
            if ((casep == 0) && (uVar2 = uVar8 + 0x20000, 0xfffbffff < uVar8)) {
              *puVar1 = uVar2;
              goto LAB_00124225;
            }
          }
          if ((uVar2 & 0xffff0000) == 0x20000) {
            *puVar1 = 0;
            return 0;
          }
        }
        *puVar1 = uVar2;
        return 0;
      }
    }
    else {
      puVar7 = HTcoll + (uVar8 - 1);
      uVar8 = *puVar7;
      if (uVar2 == (uVar8 & 0x1ffe)) {
        puVar6 = (uint *)0x0;
      }
      else {
        do {
          puVar6 = puVar7;
          if ((ulong)puVar6[1] == 0) {
            uVar4 = (ulong)*HTcoll;
            if (uVar4 == 0) {
              uVar4 = (ulong)HTcoll[1];
              if (0x7ffef < uVar4) goto LAB_001242b2;
              HTcoll[1] = HTcoll[1] + 2;
            }
            else {
              *HTcoll = HTcoll[uVar4 + 1];
            }
            pLVar5 = HTcoll + uVar4;
            pLVar5[1] = *puVar1 - 1;
            *puVar1 = (int)((ulong)((long)pLVar5 - (long)HTcoll) >> 2) + 1;
            goto LAB_00124340;
          }
          puVar7 = HTcoll + puVar6[1];
          uVar8 = *puVar7;
        } while (uVar2 != (uVar8 & 0x1ffe));
      }
      if (uVar8 < 0xfffe0000) {
        if (casep == 2) {
          uVar2 = uVar8 | 0x10000;
        }
        else {
          if (casep == 1) {
            if (uVar8 < 0x20000) {
              error("attempt to decrement 0 reference count");
            }
            uVar2 = uVar8 - 0x20000;
          }
          else {
            uVar2 = uVar8;
            if ((casep == 0) && (uVar2 = uVar8 + 0x20000, 0xfffbffff < uVar8)) {
              *puVar7 = uVar2;
LAB_00124225:
              enter_big_reference_count(ptr);
              return 0;
            }
          }
          if ((uVar2 & 0xffff0000) == 0x20000) {
            if (puVar6 == (uint *)0x0) {
              *puVar1 = puVar7[1] | 1;
            }
            else {
              puVar6[1] = puVar7[1];
            }
            *puVar7 = 0;
            puVar7[1] = *HTcoll;
            *HTcoll = (LispPTR)((ulong)((long)puVar7 - (long)HTcoll) >> 2);
            if (HTcoll[(ulong)(*puVar1 - 1) + 1] == 0) {
              puVar7 = HTcoll + (*puVar1 - 1);
              *puVar1 = *puVar7;
              *puVar7 = 0;
              puVar7[1] = *HTcoll;
              *HTcoll = (LispPTR)((ulong)((long)puVar7 - (long)HTcoll) >> 2);
              return 0;
            }
            return 0;
          }
        }
        *puVar7 = uVar2;
        return 0;
      }
    }
    modify_big_reference_count(puVar7,(DLword)casep,ptr);
  }
  return 0;
}

Assistant:

LispPTR rec_htfind(LispPTR ptr, int casep) {
  GCENTRY *entry, *link, *prev;
  GCENTRY entry_contents, hiptr;

  /* if the NOREF bit is on in the type table entry, do
  not reference count this pointer. Used for non-reference
  counted types like symbols, and also when the GC is
  disabled. */
  /*
   * Following two tests were moved into GCLOOKUP macro
   * for efficiency.
   */
  /*
      if (GetTypeEntry(ptr) & TT_NOREF)
                  return NIL;
  */
  /* if *GcDisabled_word is T then do nothing */
  /* FS:  this test should not be needed (because type table should
      be cleared).  Also, this test seems to cause an infinite
      ucode loop in remimplicitkeyhash on the 386i		*/

  /*    if(*GcDisabled_word == ATOM_T) return(NIL); */

  /* GC hash table entries have the high 8 bits of the
  pointer stored in the middle. Set up hiptr to have
  the high bits of the pointer ready to store or test
  against */

  hiptr = (((unsigned int)ptr) >> (16 - HTHISHIFT)) & HTHIMASK;

  /* entry points at the place in the main hash table
  where this pointer is stored. The 'hash' isn't one really;
  it just uses the low bits of the pointer. */

  entry = HTmain + (LOLOC(ptr) >> 1);

  entry_contents = GETGC(entry);

  if (entry_contents == 0) RecNewEntry(entry, hiptr, casep, ptr);
  /* NewEntry returns */

  if (entry_contents & 1) { /* low bit means a collision entry */
    /* entry_contents-1 removes low bit */
    link = HTcoll + (entry_contents - 1);
    prev = 0;
    goto newlink;
  }

  if (hiptr == (entry_contents & HTHIMASK)) {
    RecModEntry(entry, entry_contents, ptr, casep, delentry);
    /* ModEntry returns or will go to delentry */
  }

  /* new collision */

  GetLink(link);
  GetLink(prev);
  GETGC((GCENTRY *)prev + 1) = 0;
  GETGC((GCENTRY *)prev) = entry_contents;
  GETGC((GCENTRY *)link + 1) = prev - HTcoll;
  GETGC((GCENTRY *)entry) = (link - HTcoll) + 1;

  RecNewEntry(link, hiptr, casep, ptr);

delentry:
  GETGC(entry) = 0;
  return NIL;

/* start here when a collision is detected. link is a pointer to
  the entry in the collision table, prev is the previous collision
  entry or 0 if this is the first one. */

newlink:
  entry_contents = GETGC(link);
  if (hiptr == (entry_contents & HTHIMASK)) {
    RecModEntry(link, entry_contents, ptr, casep, dellink);
    /* ModEntry returns or goes to dellink */
  }
  /* collision didn't match  */
  entry_contents = GETGC(link + 1);
  if (entry_contents == 0) { goto nolink; }
  /* try the next link in the collision table */
  prev = link;
  link = HTcoll + entry_contents;
  goto newlink;

dellink:
  if (prev)
    GETGC((GCENTRY *)prev + 1) = GETGC((GCENTRY *)link + 1);
  else
    GETGC((GCENTRY *)entry) = (GETGC((GCENTRY *)link + 1)) | 1;

  FreeLink(link);
  link = HTcoll + ((GETGC((GCENTRY *)entry)) - 1);
  if (GETGC((GCENTRY *)link + 1) == 0) {
    GETGC((GCENTRY *)entry) = GETGC((GCENTRY *)link);
    FreeLink(link);
  }
  return NIL;

nolink: /* no match */

  GetLink(link);
  GETGC((GCENTRY *)link + 1) = GETGC((GCENTRY *)entry) - 1;
  GETGC((GCENTRY *)entry) = (link - HTcoll) + 1;
  RecNewEntry(link, hiptr, casep, ptr);
}